

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVLDST2Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint16_t *puVar5;
  uint64_t extraout_RDX;
  uint64_t uVar6;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint uVar7;
  bool bVar8;
  
  bVar8 = (~Insn & 0xc0) == 0;
  uVar3 = Insn & 0xe30;
  if (uVar3 == 0x830 || bVar8) {
    return MCDisassembler_Fail;
  }
  if ((Insn >> 0x15 & 1) == 0) {
    DVar1 = DecodeVSTInstruction
                      (Inst,Insn,Address,
                       (void *)(ulong)CONCAT31((int3)(uVar3 >> 8),uVar3 == 0x830 || bVar8));
    return DVar1;
  }
  uVar7 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar3 = MCInst_getOpcode(Inst);
  if (uVar3 - 0x391 < 0xc) {
LAB_0015203b:
    if (uVar7 == 0x1f) {
      return MCDisassembler_Fail;
    }
    puVar5 = DPairDecoderTable;
  }
  else if (uVar3 - 0x3d2 < 9) {
    if (0x1d < uVar7) {
      return MCDisassembler_Fail;
    }
    puVar5 = DPairSpacedDecoderTable;
  }
  else {
    if (uVar3 - 0x3db < 9) goto LAB_0015203b;
    puVar5 = DPRDecoderTable;
  }
  MCOperand_CreateReg0(Inst,(uint)puVar5[uVar7]);
  uVar2 = MCInst_getOpcode(Inst);
  iVar4 = 1;
  uVar3 = uVar2 - 0x43d;
  if (uVar3 < 0x22) {
    if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_001520a7;
LAB_001520cc:
      iVar4 = 2;
    }
LAB_001520d1:
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[iVar4 + uVar7 & 0x1f]);
  }
  else {
LAB_001520a7:
    uVar2 = uVar2 - 0x4b1;
    if (uVar2 < 0x22) {
      if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_001520d1;
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_001520cc;
    }
  }
  uVar2 = MCInst_getOpcode(Inst);
  puVar5 = (uint16_t *)0x2;
  uVar3 = uVar2 - 0x43d;
  if (uVar3 < 0x22) {
    if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_00152124;
LAB_00152149:
      puVar5 = (uint16_t *)0x4;
    }
LAB_0015214e:
    puVar5 = (uint16_t *)(ulong)((int)puVar5 + uVar7 & 0x1f);
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[(long)puVar5]);
  }
  else {
LAB_00152124:
    uVar2 = uVar2 - 0x4b1;
    if (uVar2 < 0x22) {
      if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_0015214e;
      puVar5 = (uint16_t *)0x294a00000;
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00152149;
    }
  }
  uVar2 = Insn >> 0x10 & 0xf;
  uVar3 = MCInst_getOpcode(Inst);
  uVar3 = uVar3 - 0x4b1;
  if (uVar3 < 0x22) {
    puVar5 = (uint16_t *)0x3;
    if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      puVar5 = (uint16_t *)0x294a00000;
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_001521c4;
      puVar5 = (uint16_t *)0x6;
    }
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar7 + (int)puVar5 & 0x1f]);
  }
LAB_001521c4:
  uVar3 = MCInst_getOpcode(Inst);
  uVar6 = extraout_RDX;
  if ((int)uVar3 < 0x3d3) {
    if ((uVar3 - 0x369 < 0x34) &&
       (puVar5 = (uint16_t *)0xdb6f67860f67b,
       (0xdb6f67860f67bU >> ((ulong)(uVar3 - 0x369) & 0x3f) & 1) != 0)) {
LAB_00152211:
      MCOperand_CreateImm0(Inst,0);
      uVar6 = extraout_RDX_00;
    }
  }
  else {
    puVar5 = (uint16_t *)(ulong)(uVar3 - 0x3d3);
    if ((uVar3 - 0x3d3 < 0x23) &&
       (uVar6 = 0x61861b6db, (0x61861b6dbU >> ((ulong)puVar5 & 0x3f) & 1) != 0)) goto LAB_00152211;
    uVar7 = uVar3 - 0x440;
    puVar5 = (uint16_t *)(ulong)uVar7;
    if (((uVar7 < 0x1f) && (uVar6 = 0x42100111, (0x42100111U >> (uVar7 & 0x1f) & 1) != 0)) ||
       ((uVar3 - 0x4b4 < 0x1f &&
        (puVar5 = (uint16_t *)0x42100111, (0x42100111U >> (uVar3 - 0x4b4 & 0x1f) & 1) != 0)))) {
      puVar5 = GPRDecoderTable;
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar2]);
      uVar6 = extraout_RDX_01;
    }
  }
  DVar1 = DecodeAddrMode6Operand(Inst,Insn & 0x30 | uVar2,uVar6,puVar5);
  if ((DVar1 | 2) != MCDisassembler_Success) {
    return MCDisassembler_Fail;
  }
  uVar3 = MCInst_getOpcode(Inst);
  if ((0x33 < uVar3 - 0x369) || ((0xdb6d26820d269U >> ((ulong)(uVar3 - 0x369) & 0x3f) & 1) == 0)) {
    if ((uVar3 - 0x3d3 < 0x22) && ((0x208209249U >> ((ulong)(uVar3 - 0x3d3) & 0x3f) & 1) != 0)) {
      return DVar1;
    }
    uVar3 = 0;
    if ((Insn & 0xf) == 0xd) goto LAB_00152271;
  }
  if ((~Insn & 0xd) == 0) {
    return DVar1;
  }
  uVar3 = (uint)GPRDecoderTable[Insn & 0xf];
LAB_00152271:
  MCOperand_CreateReg0(Inst,uVar3);
  return DVar1;
}

Assistant:

static DecodeStatus DecodeVLDST2Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned type, align, load;
	unsigned size = fieldFromInstruction_4(Insn, 6, 2);
	if (size == 3) return MCDisassembler_Fail;

	type = fieldFromInstruction_4(Insn, 8, 4);
	align = fieldFromInstruction_4(Insn, 4, 2);
	if (type == 8 && align == 3) return MCDisassembler_Fail;
	if (type == 9 && align == 3) return MCDisassembler_Fail;

	load = fieldFromInstruction_4(Insn, 21, 1);
	return load ? DecodeVLDInstruction(Inst, Insn, Address, Decoder)
		: DecodeVSTInstruction(Inst, Insn, Address, Decoder);
}